

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QXmlStreamAttribute>::reserve(QList<QXmlStreamAttribute> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  uint uVar2;
  Data *pDVar3;
  long lVar4;
  QXmlStreamAttribute *b;
  undefined1 auVar5 [16];
  qsizetype qVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QXmlStreamAttribute>_*,_QXmlStreamAttribute_*> local_38;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if (pDVar3 == (Data *)0x0) {
    qVar7 = 0;
  }
  else {
    qVar7 = (pDVar3->super_QArrayData).alloc;
  }
  qVar6 = QArrayDataPointer<QXmlStreamAttribute>::freeSpaceAtBegin(&this->d);
  if ((asize <= qVar7 - qVar6) && (pDVar3 = (this->d).d, pDVar3 != (Data *)0x0)) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_0035a569;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_0035a569;
    }
  }
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_38 = QTypedArrayData<QXmlStreamAttribute>::allocate(asize,KeepSize);
  local_28 = 0;
  b = (this->d).ptr;
  QtPrivate::QGenericArrayOps<QXmlStreamAttribute>::copyAppend
            ((QGenericArrayOps<QXmlStreamAttribute> *)&local_38,b,b + (this->d).size);
  if (local_38.first != (Data *)0x0) {
    pAVar1 = &((local_38.first)->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  auVar5._0_8_ = (this->d).d;
  auVar5._8_8_ = (this->d).ptr;
  (this->d).d = local_38.first;
  (this->d).ptr = local_38.second;
  qVar7 = (this->d).size;
  (this->d).size = local_28;
  local_38 = (pair<QTypedArrayData<QXmlStreamAttribute>_*,_QXmlStreamAttribute_*>)auVar5;
  local_28 = qVar7;
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_38);
LAB_0035a569:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}